

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-square.c
# Opt level: O2

void square_destroy(chunk_conflict *c,loc grid)

{
  uint32_t uVar1;
  undefined4 uStack_20;
  
  uVar1 = Rand_div(200);
  if ((int)uVar1 < 0x14) {
    uStack_20 = L'\x15';
  }
  else if (uVar1 < 0x46) {
    uStack_20 = L'\x12';
  }
  else {
    uStack_20 = (uint)(uVar1 < 100) * 0x10 + L'\x01';
  }
  square_set_feat(c,grid,uStack_20);
  return;
}

Assistant:

void square_destroy(struct chunk *c, struct loc grid) {
	int feat = FEAT_FLOOR;
	int r = randint0(200);

	if (r < 20)
		feat = FEAT_GRANITE;
	else if (r < 70)
		feat = FEAT_QUARTZ;
	else if (r < 100)
		feat = FEAT_MAGMA;

	square_set_feat(c, grid, feat);
}